

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O1

int secp256k1_whitelist_compute_keys_and_message
              (secp256k1_context *ctx,uchar *msg32,secp256k1_gej *keys,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,int n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  int iVar1;
  ulong uVar2;
  uchar c [33];
  secp256k1_ge offline_ge;
  secp256k1_sha256 sha;
  secp256k1_gej tweaked_gej;
  secp256k1_scalar tweak;
  secp256k1_ge online_ge;
  secp256k1_ge subkey_ge;
  size_t local_2c0;
  secp256k1_context *local_2b8;
  secp256k1_pubkey *local_2b0;
  uchar *local_2a8;
  secp256k1_pubkey *local_2a0;
  secp256k1_scalar local_298;
  uchar local_278 [48];
  secp256k1_ge local_248;
  secp256k1_sha256 local_1f0;
  secp256k1_gej local_188;
  secp256k1_scalar local_100;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  local_2c0 = 0x21;
  local_1f0.s[0] = 0x6a09e667;
  local_1f0.s[1] = 0xbb67ae85;
  local_1f0.s[2] = 0x3c6ef372;
  local_1f0.s[3] = 0xa54ff53a;
  local_1f0.s[4] = 0x510e527f;
  local_1f0.s[5] = 0x9b05688c;
  local_1f0.s[6] = 0x1f83d9ab;
  local_1f0.s[7] = 0x5be0cd19;
  local_1f0.bytes = 0;
  local_2b8 = ctx;
  local_2b0 = online_pubkeys;
  local_2a8 = msg32;
  secp256k1_pubkey_load(ctx,&local_88,sub_pubkey);
  iVar1 = secp256k1_eckey_pubkey_serialize(&local_88,local_278,&local_2c0,0x102);
  if (iVar1 == 0) {
LAB_0012bb4f:
    iVar1 = 0;
  }
  else {
    secp256k1_sha256_write(&local_1f0,local_278,local_2c0);
    if (0 < n_keys) {
      uVar2 = (ulong)(uint)n_keys;
      do {
        local_2a0 = offline_pubkeys;
        secp256k1_pubkey_load(local_2b8,&local_248,offline_pubkeys);
        iVar1 = secp256k1_eckey_pubkey_serialize(&local_248,local_278,&local_2c0,0x102);
        if (iVar1 == 0) goto LAB_0012bb4f;
        secp256k1_sha256_write(&local_1f0,local_278,local_2c0);
        secp256k1_pubkey_load(local_2b8,&local_e0,local_2b0);
        iVar1 = secp256k1_eckey_pubkey_serialize(&local_e0,local_278,&local_2c0,0x102);
        if (iVar1 == 0) goto LAB_0012bb4f;
        secp256k1_sha256_write(&local_1f0,local_278,local_2c0);
        local_188.infinity = local_248.infinity;
        local_188.x.n[4] = local_248.x.n[4];
        local_188.x.n[2] = local_248.x.n[2];
        local_188.x.n[3] = local_248.x.n[3];
        local_188.x.n[0] = local_248.x.n[0];
        local_188.x.n[1] = local_248.x.n[1];
        local_188.y.n[4] = local_248.y.n[4];
        local_188.y.n[2] = local_248.y.n[2];
        local_188.y.n[3] = local_248.y.n[3];
        local_188.y.n[0] = local_248.y.n[0];
        local_188.y.n[1] = local_248.y.n[1];
        local_188.z.n[0] = 1;
        local_188.z.n[3] = 0;
        local_188.z.n[4] = 0;
        local_188.z.n[1] = 0;
        local_188.z.n[2] = 0;
        secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,(secp256k1_fe *)0x0);
        local_298.d[2] = 0;
        local_298.d[3] = 0;
        local_298.d[0] = 0;
        local_298.d[1] = 0;
        iVar1 = secp256k1_whitelist_hash_pubkey(&local_100,&local_188);
        if (iVar1 != 0) {
          secp256k1_ecmult(&local_2b8->ecmult_ctx,&local_188,&local_188,&local_100,&local_298);
        }
        secp256k1_gej_add_ge_var(keys,&local_188,&local_e0,(secp256k1_fe *)0x0);
        keys = keys + 1;
        local_2b0 = local_2b0 + 1;
        offline_pubkeys = local_2a0 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    secp256k1_sha256_finalize(&local_1f0,local_2a8);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int secp256k1_whitelist_compute_keys_and_message(const secp256k1_context* ctx, unsigned char *msg32, secp256k1_gej *keys, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const int n_keys, const secp256k1_pubkey *sub_pubkey) {
    unsigned char c[33];
    size_t size = 33;
    secp256k1_sha256 sha;
    int i;
    secp256k1_ge subkey_ge;

    secp256k1_sha256_initialize(&sha);
    secp256k1_pubkey_load(ctx, &subkey_ge, sub_pubkey);

    /* commit to sub-key */
    if (!secp256k1_eckey_pubkey_serialize(&subkey_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    for (i = 0; i < n_keys; i++) {
        secp256k1_ge offline_ge;
        secp256k1_ge online_ge;
        secp256k1_gej tweaked_gej;

        /* commit to fixed keys */
        secp256k1_pubkey_load(ctx, &offline_ge, &offline_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&offline_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);
        secp256k1_pubkey_load(ctx, &online_ge, &online_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&online_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);

        /* compute tweaked keys */
        secp256k1_gej_set_ge(&tweaked_gej, &offline_ge);
        secp256k1_gej_add_ge_var(&tweaked_gej, &tweaked_gej, &subkey_ge, NULL);
        secp256k1_whitelist_tweak_pubkey(ctx, &tweaked_gej);
        secp256k1_gej_add_ge_var(&keys[i], &tweaked_gej, &online_ge, NULL);
    }
    secp256k1_sha256_finalize(&sha, msg32);
    return 1;
}